

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O1

void Amap_ManMergeNodeCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  Amap_Cut_t AVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  uint *puVar10;
  uint uVar11;
  Amap_Cut_t *pCut1;
  uint uVar12;
  uint uVar13;
  Amap_Cut_t *pCut0;
  uint uVar14;
  uint uVar15;
  Amap_Cut_t *pAVar16;
  uint uVar17;
  Amap_Cut_t *pAVar18;
  
  if (pNode->Fan[0] < 0) {
LAB_003b29f3:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10c,"int Abc_Lit2Var(int)");
  }
  uVar8 = (uint)pNode->Fan[0] >> 1;
  iVar2 = p->vObjs->nSize;
  if ((int)uVar8 < iVar2) {
    if (pNode->Fan[1] < 0) goto LAB_003b29f3;
    uVar11 = (uint)pNode->Fan[1] >> 1;
    if ((int)uVar11 < iVar2) {
      if ((pNode->field_11).pData != (void *)0x0) {
        __assert_fail("pNode->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                      ,0x1c1,"void Amap_ManMergeNodeCuts(Amap_Man_t *, Amap_Obj_t *)");
      }
      ppvVar4 = p->vObjs->pArray;
      pvVar5 = ppvVar4[uVar8];
      pvVar6 = ppvVar4[uVar11];
      if ((*(uint *)pNode & 7) == 4) {
        lVar9 = 0x80;
      }
      else {
        if ((*(uint *)pNode & 7) == 6) {
          Amap_ManMergeNodeCutsMux(p,pNode);
          return;
        }
        lVar9 = 0x88;
      }
      if (0xfff < *(uint *)((long)pvVar5 + 8)) {
        lVar9 = *(long *)((long)&p->pLib->pName + lVar9);
        pAVar18 = *(Amap_Cut_t **)((long)pvVar5 + 0x20);
        uVar8 = 0;
        do {
          if (pNode->Fan[0] < 0) {
LAB_003b29b5:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10d,"int Abc_LitIsCompl(int)");
          }
          AVar3 = *pAVar18;
          uVar15 = (uint)AVar3 >> 0x10 & 1;
          uVar14 = pNode->Fan[0] & 1;
          uVar11 = (uVar15 ^ uVar14) + ((uint)AVar3 & 0xffff) * 2;
          if (((uint)AVar3 & 0xffff) == 0) {
            uVar11 = 0;
          }
          if (uVar15 != uVar14 && ((uint)AVar3 & 0xfffe0000) == 0x20000) {
            if ((int)pAVar18[1] < 0) goto LAB_003b29d4;
            pAVar18[1] = (Amap_Cut_t)((uint)pAVar18[1] ^ 1);
          }
          puVar10 = *(uint **)(lVar9 + (ulong)uVar11 * 8);
          uVar12 = *puVar10;
          if (uVar12 != 0) {
            piVar7 = p->pMatsTemp;
            do {
              puVar10 = puVar10 + 1;
              piVar7[uVar12 & 0xffff] = (int)uVar12 >> 0x10;
              uVar12 = *puVar10;
            } while (uVar12 != 0);
          }
          if (0xfff < *(uint *)((long)pvVar6 + 8)) {
            pAVar16 = *(Amap_Cut_t **)((long)pvVar6 + 0x20);
            uVar12 = 0;
            do {
              if (pNode->Fan[1] < 0) goto LAB_003b29b5;
              AVar3 = *pAVar16;
              uVar13 = (uint)AVar3 >> 0x10 & 1;
              uVar17 = pNode->Fan[1] & 1;
              uVar1 = (uVar13 ^ uVar17) + ((uint)AVar3 & 0xffff) * 2;
              if (((uint)AVar3 & 0xffff) == 0) {
                uVar1 = 0;
              }
              piVar7 = p->pMatsTemp;
              if (piVar7[uVar1] != 0) {
                if (uVar13 != uVar17 && ((uint)AVar3 & 0xfffe0000) == 0x20000) {
                  if ((int)pAVar16[1] < 0) goto LAB_003b29d4;
                  pAVar16[1] = (Amap_Cut_t)((uint)pAVar16[1] ^ 1);
                }
                pCut1 = pAVar16;
                pCut0 = pAVar18;
                if (uVar11 < uVar1) {
                  pCut1 = pAVar18;
                  pCut0 = pAVar16;
                }
                Amap_ManCutCreate(p,pCut0,pCut1,piVar7[uVar1]);
                if (((uint)*pAVar16 & 0xfffe0000) == 0x20000 && uVar13 != uVar17) {
                  if ((int)pAVar16[1] < 0) goto LAB_003b29d4;
                  pAVar16[1] = (Amap_Cut_t)((uint)pAVar16[1] ^ 1);
                }
              }
              uVar12 = uVar12 + 1;
              pAVar16 = pAVar16 + (ulong)((uint)*pAVar16 >> 0x11) + 1;
            } while (uVar12 < *(uint *)((long)pvVar6 + 8) >> 0xc);
          }
          if (((uint)*pAVar18 & 0xfffe0000) == 0x20000 && uVar15 != uVar14) {
            if ((int)pAVar18[1] < 0) {
LAB_003b29d4:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10e,"int Abc_LitNot(int)");
            }
            pAVar18[1] = (Amap_Cut_t)((uint)pAVar18[1] ^ 1);
          }
          puVar10 = *(uint **)(lVar9 + (ulong)uVar11 * 8);
          uVar11 = *puVar10;
          if (uVar11 != 0) {
            piVar7 = p->pMatsTemp;
            do {
              puVar10 = puVar10 + 1;
              piVar7[uVar11 & 0xffff] = 0;
              uVar11 = *puVar10;
            } while (uVar11 != 0);
          }
          uVar8 = uVar8 + 1;
          pAVar18 = pAVar18 + (ulong)((uint)*pAVar18 >> 0x11) + 1;
        } while (uVar8 < *(uint *)((long)pvVar5 + 8) >> 0xc);
      }
      Amap_ManCutSaveStored(p,pNode);
      p->nCutsUsed = p->nCutsUsed + (*(uint *)&pNode->field_0x8 >> 0xc);
      p->nCutsTried =
           p->nCutsTried +
           (*(uint *)((long)pvVar6 + 8) >> 0xc) * (*(uint *)((long)pvVar5 + 8) >> 0xc);
      if ((pNode->field_0x7 & 0x40) != 0) {
        Amap_ManMergeNodeChoice(p,pNode);
        return;
      }
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Amap_ManMergeNodeCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int ** pRules, Entry, i, k, c, iCompl0, iCompl1, iFan0, iFan1;
    assert( pNode->pData == NULL );
    if ( pNode->Type == AMAP_OBJ_MUX )
    {
        Amap_ManMergeNodeCutsMux( p, pNode );
        return;
    }
    assert( pNode->Type != AMAP_OBJ_MUX );
    pRules = (pNode->Type == AMAP_OBJ_AND)? p->pLib->pRules: p->pLib->pRulesX;
    Amap_NodeForEachCut( pFanin0, pCut0, c )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        // complement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = (Entry >> 16);
        // iterate through the cuts
        Amap_NodeForEachCut( pFanin1, pCut1, k )
        {
            iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
            iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
            if ( p->pMatsTemp[iFan1] == 0 )
                continue;
            // complement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            // create new cut
            if ( iFan0 >= iFan1 )
                Amap_ManCutCreate( p, pCut0, pCut1, p->pMatsTemp[iFan1] );
            else
                Amap_ManCutCreate( p, pCut1, pCut0, p->pMatsTemp[iFan1] );
            // uncomplement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
        }
        // uncomplement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = 0;
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried += pFanin0->nCuts * pFanin1->nCuts;
//    assert( (int)pNode->nCuts == Amap_ManMergeCountCuts(p, pNode) );
    if ( pNode->fRepr )
        Amap_ManMergeNodeChoice( p, pNode );

//    Amap_ManPrintCuts( pNode );
}